

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall
Potassco::SmodelsConvert::SmData::addMinimize(SmData *this,Weight_t prio,WeightLitSpan *lits)

{
  Weight_t WVar1;
  value_type *__x;
  WeightLit_t *pWVar2;
  Span<Potassco::WeightLit_t> *in_RDX;
  undefined4 in_ESI;
  key_type_conflict *in_RDI;
  map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
  *unaff_retaddr;
  WeightLit_t x;
  WeightLit_t *it;
  WLitVec *body;
  int iVar3;
  WeightLit_t this_00;
  WeightLit_t *local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  __x = (value_type *)
        std::
        map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
        ::operator[](unaff_retaddr,in_RDI);
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::size
            ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)__x);
  size<Potassco::WeightLit_t>(in_RDX);
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::reserve
            ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_type)in_RDX);
  local_28 = begin<Potassco::WeightLit_t>(in_RDX);
  while( true ) {
    pWVar2 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x11e801);
    if (local_28 == pWVar2) break;
    this_00 = *local_28;
    WVar1 = weight((WeightLit_t *)&stack0xffffffffffffffd0);
    if (WVar1 < 0) {
      iVar3 = this_00.lit;
      this_00.weight = -this_00.weight;
      this_00.lit = -iVar3;
    }
    std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::push_back
              ((vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)this_00,__x)
    ;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void addMinimize(Weight_t prio, const WeightLitSpan& lits) {
		WLitVec& body = minimize_[prio];
		body.reserve(body.size() + size(lits));
		for (const WeightLit_t* it = begin(lits); it != end(lits); ++it) {
			WeightLit_t x = *it;
			if (weight(x) < 0) {
				x.lit = -x.lit;
				x.weight = -x.weight;
			}
			body.push_back(x);
		}
	}